

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lzham_lzcomp_internal.cpp
# Opt level: O3

bool __thiscall
lzham::lzcompressor::optimal_parse(lzcompressor *this,parse_thread_state *parse_state)

{
  search_accelerator *dict;
  uint *puVar1;
  node *__s;
  uint *lzdec;
  vector<lzham::lzcompressor::lzdecision> *pvVar2;
  int iVar3;
  uint is_match_model_index;
  state *this_00;
  uchar *puVar4;
  ulong uVar5;
  undefined8 uVar6;
  node_state *pnVar7;
  uint uVar8;
  char cVar9;
  char cVar10;
  uint lit_pred0;
  uint uVar11;
  uint uVar12;
  uint8 *pComp;
  bit_cost_t bVar13;
  ulong uVar14;
  dict_match *pdVar15;
  uint16 *puVar16;
  lzdecision *plVar17;
  uint uVar18;
  uint uVar19;
  long lVar20;
  ulong uVar21;
  lzdecision *plVar22;
  undefined2 uVar23;
  node *pnVar24;
  uint uVar25;
  uint uVar26;
  node *pnVar27;
  ulong uVar28;
  uint uVar29;
  uint uVar30;
  long lVar31;
  ulong uVar32;
  uint l;
  uint uVar33;
  ulong uVar34;
  bool bVar35;
  uint local_cdc;
  ulong local_cd8;
  uint local_ccc;
  uint match_distances [128];
  uint match_lens [128];
  bit_cost_t lzdec_bitcosts [258];
  
  (parse_state->super_raw_parse_thread_state).m_failed = false;
  (parse_state->super_raw_parse_thread_state).m_emit_decisions_backwards = true;
  __s = (parse_state->super_raw_parse_thread_state).m_nodes;
  *(undefined2 *)
   ((long)&(parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_total_cost + 4)
       = 0xffff;
  *(undefined8 *)
   ((parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_saved_state.
    m_match_hist + 3) = 0;
  *(undefined4 *)
   &(parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[0].m_total_cost = 0;
  uVar26 = (parse_state->super_raw_parse_thread_state).m_bytes_to_match;
  pnVar24 = __s;
  if (uVar26 == 0) {
    uVar14 = 0;
  }
  else {
    this_00 = (parse_state->super_raw_parse_thread_state).m_pState;
    local_cdc = (parse_state->super_raw_parse_thread_state).m_start_ofs;
    dict = &this->m_accel;
    local_ccc = local_cdc - ((this->m_accel).m_lookahead_pos & (this->m_accel).m_max_dict_size_mask)
    ;
    puVar1 = (this_00->super_state_base).m_match_hist;
    uVar14 = 0;
    do {
      uVar19 = (uint)uVar14;
      lzdec = &__s->m_node_states[uVar14 - 1].m_total_complexity;
      if (((parse_state->super_raw_parse_thread_state).m_parse_early_out_thresh <= uVar19) &&
         ((node *)lzdec == pnVar24)) break;
      uVar25 = uVar26 - uVar19;
      uVar33 = 0x101;
      if (uVar25 < 0x101) {
        uVar33 = uVar25;
      }
      uVar12 = (this->m_accel).m_cur_dict_size;
      if (uVar19 != 0) {
        (this_00->super_state_base).m_cur_ofs = lzdec[3];
        (this_00->super_state_base).m_cur_state = lzdec[4];
        uVar6 = *(undefined8 *)(lzdec + 7);
        *(undefined8 *)puVar1 = *(undefined8 *)(lzdec + 5);
        *(undefined8 *)((this_00->super_state_base).m_match_hist + 2) = uVar6;
        state_base::partial_advance(&this_00->super_state_base,(lzdecision *)lzdec);
      }
      lVar20 = *(long *)(lzdec + 10);
      iVar3 = lzdec[0xc];
      uVar29 = 1;
      lit_pred0 = state::get_pred_char(this_00,dict,local_cdc,1);
      is_match_model_index = (this_00->super_state_base).m_cur_state;
      puVar4 = (this->m_accel).m_dict.m_p;
      uVar32 = (ulong)(uVar33 + (uVar33 == 0));
      lVar31 = 0;
      local_cd8 = 0;
      do {
        uVar23 = (undefined2)uVar14;
        if ((puVar1[lVar31] <= uVar12 + local_ccc) && (uVar26 != uVar19)) {
          uVar34 = 0;
          do {
            uVar21 = uVar34;
            if ((this->m_accel).m_dict.m_p
                [uVar34 + ((local_ccc - puVar1[lVar31]) + (this->m_accel).m_lookahead_pos &
                          (this->m_accel).m_max_dict_size_mask)] != puVar4[uVar34 + local_cdc])
            break;
            uVar34 = uVar34 + 1;
            uVar21 = uVar32;
          } while (uVar32 != uVar34);
          uVar18 = (uint)uVar21;
          if (uVar29 <= uVar18) {
            uVar30 = (uint)lVar31;
            state::get_rep_match_costs
                      (this_00,local_cdc,lzdec_bitcosts,uVar30,uVar29,uVar18,is_match_model_index);
            uVar11 = iVar3 + 2 + uVar30;
            pnVar7 = (parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states +
                     uVar14 + ((ulong)uVar29 - 1);
            uVar34 = (ulong)uVar29;
            do {
              pnVar27 = (node *)((long)pnVar7 + 0x30);
              uVar28 = lzdec_bitcosts[uVar34] + lVar20;
              uVar5 = *(ulong *)((long)pnVar27->m_node_states[0].m_saved_state.m_match_hist + 0xc);
              if ((uVar28 <= uVar5) &&
                 ((uVar28 != uVar5 || (uVar11 < (uint)pnVar27->m_node_states[0].m_total_cost)))) {
                *(ulong *)((long)pnVar27->m_node_states[0].m_saved_state.m_match_hist + 0xc) =
                     uVar28;
                *(uint *)&pnVar27->m_node_states[0].m_total_cost = uVar11;
                *(undefined2 *)((long)&pnVar27->m_node_states[0].m_total_cost + 4) = uVar23;
                pnVar27->m_node_states[0].m_lzdec.m_len = (this_00->super_state_base).m_cur_ofs;
                pnVar27->m_node_states[0].m_lzdec.m_dist = (this_00->super_state_base).m_cur_state;
                uVar8 = puVar1[1];
                uVar6 = *(undefined8 *)((this_00->super_state_base).m_match_hist + 2);
                pnVar27->m_node_states[0].m_saved_state.m_cur_ofs = puVar1[0];
                pnVar27->m_node_states[0].m_saved_state.m_cur_state = uVar8;
                *(undefined8 *)pnVar27->m_node_states[0].m_saved_state.m_match_hist = uVar6;
                pnVar27->m_num_node_states = local_cdc;
                pnVar27->m_node_states[0].m_lzdec.m_pos = ~uVar30;
                *(int *)&pnVar27->field_0x4 = (int)uVar34;
                if (pnVar24 < pnVar27) {
                  pnVar24 = pnVar27;
                }
              }
              pnVar7 = pnVar27->m_node_states;
              bVar35 = uVar34 < (uVar21 & 0xffffffff);
              uVar34 = uVar34 + 1;
            } while (bVar35);
            if (uVar18 < (uint)local_cd8) {
              uVar21 = local_cd8;
            }
            local_cd8 = uVar21 & 0xffffffff;
          }
        }
        lVar31 = lVar31 + 1;
        uVar29 = 2;
      } while (lVar31 != 4);
      if ((uint)local_cd8 < this->m_fast_bytes) {
        uVar29 = (uint)local_cd8;
        if (1 < uVar25) {
          if (((uint)local_cd8 < 2) &&
             (uVar12 = search_accelerator::get_len2_match(dict,local_ccc), uVar12 != 0)) {
            bVar13 = state::get_len2_match_cost
                               (this_00,&this->super_CLZBase,local_cdc,uVar12,is_match_model_index);
            uVar14 = bVar13 + lVar20;
            if ((uVar14 < *(ulong *)(lzdec + 0x26)) ||
               ((local_cd8 = 2, uVar14 == *(ulong *)(lzdec + 0x26) && (iVar3 + 7U < lzdec[0x28]))))
            {
              *(ulong *)(lzdec + 0x26) = uVar14;
              lzdec[0x28] = iVar3 + 7U;
              *(undefined2 *)(lzdec + 0x29) = uVar23;
              lzdec[0x1f] = (this_00->super_state_base).m_cur_ofs;
              lzdec[0x20] = (this_00->super_state_base).m_cur_state;
              uVar6 = *(undefined8 *)((this_00->super_state_base).m_match_hist + 2);
              *(undefined8 *)(lzdec + 0x21) = *(undefined8 *)puVar1;
              *(undefined8 *)(lzdec + 0x23) = uVar6;
              lzdec[0x1c] = local_cdc;
              lzdec[0x1d] = 2;
              lzdec[0x1e] = uVar12;
              if (pnVar24 < lzdec + 0x1c) {
                pnVar24 = (node *)(lzdec + 0x1c);
              }
              local_cd8 = 2;
            }
          }
          pdVar15 = search_accelerator::find_matches(dict,local_ccc,true);
          uVar29 = (uint)local_cd8;
          if (pdVar15 != (dict_match *)0x0) {
            puVar16 = &pdVar15->m_len;
            uVar25 = 0;
            uVar14 = local_cd8;
            do {
              uVar29 = *puVar16 + 2;
              if (uVar33 <= *puVar16 + 2) {
                uVar29 = uVar33;
              }
              uVar18 = ((dict_match *)(puVar16 + -2))->m_dist;
              if ((uint)uVar14 < uVar29) {
                match_lens[uVar25] = uVar29;
                match_distances[uVar25] = uVar18 & 0x7fffffff;
                uVar25 = uVar25 + 1;
                uVar14 = (ulong)uVar29;
              }
              puVar16 = puVar16 + 3;
            } while (-1 < (int)uVar18);
            uVar29 = (uint)uVar14;
            if (uVar25 != 0) {
              local_cd8._0_4_ = (uint)local_cd8 + ((uint)local_cd8 == 0);
              uVar32 = 0;
              do {
                uVar33 = (uint)local_cd8 + 1;
                local_cd8._0_4_ = match_lens[uVar32];
                uVar12 = match_distances[uVar32];
                state::get_full_match_costs
                          (this_00,&this->super_CLZBase,local_cdc,lzdec_bitcosts,uVar12,uVar33,
                           (uint)local_cd8,is_match_model_index);
                for (; uVar33 <= (uint)local_cd8; uVar33 = uVar33 + 1) {
                  uVar34 = (ulong)uVar33;
                  pnVar27 = (node *)(lzdec + uVar34 * 0xe);
                  uVar21 = lzdec_bitcosts[uVar34] + lVar20;
                  uVar18 = (uVar33 < 9) + 6 + iVar3;
                  if ((uVar21 <= *(ulong *)(lzdec + uVar34 * 0xe + 10)) &&
                     ((uVar21 != *(ulong *)(lzdec + uVar34 * 0xe + 10) ||
                      (uVar18 < (uint)pnVar27->m_node_states[0].m_total_cost)))) {
                    *(ulong *)((long)pnVar27->m_node_states[0].m_saved_state.m_match_hist + 0xc) =
                         uVar21;
                    *(uint *)&pnVar27->m_node_states[0].m_total_cost = uVar18;
                    *(undefined2 *)((long)&pnVar27->m_node_states[0].m_total_cost + 4) = uVar23;
                    pnVar27->m_node_states[0].m_lzdec.m_len = (this_00->super_state_base).m_cur_ofs;
                    pnVar27->m_node_states[0].m_lzdec.m_dist =
                         (this_00->super_state_base).m_cur_state;
                    uVar30 = puVar1[1];
                    uVar6 = *(undefined8 *)((this_00->super_state_base).m_match_hist + 2);
                    pnVar27->m_node_states[0].m_saved_state.m_cur_ofs = puVar1[0];
                    pnVar27->m_node_states[0].m_saved_state.m_cur_state = uVar30;
                    *(undefined8 *)pnVar27->m_node_states[0].m_saved_state.m_match_hist = uVar6;
                    pnVar27->m_num_node_states = local_cdc;
                    *(uint *)&pnVar27->field_0x4 = uVar33;
                    pnVar27->m_node_states[0].m_lzdec.m_pos = uVar12;
                    if (pnVar24 < pnVar27) {
                      pnVar24 = pnVar27;
                    }
                  }
                }
                uVar32 = uVar32 + 1;
              } while (uVar32 != uVar25);
            }
          }
        }
        local_cd8._0_4_ = uVar29;
        if ((uint)local_cd8 < this->m_fast_bytes) {
          bVar13 = state::get_lit_cost(this_00,&this->super_CLZBase,dict,local_cdc,lit_pred0,
                                       is_match_model_index);
          uVar14 = bVar13 + lVar20;
          if ((uVar14 < *(ulong *)(lzdec + 0x18)) ||
             ((uVar14 == *(ulong *)(lzdec + 0x18) && (iVar3 + 1U < lzdec[0x1a])))) {
            *(ulong *)(lzdec + 0x18) = uVar14;
            lzdec[0x1a] = iVar3 + 1U;
            *(undefined2 *)(lzdec + 0x1b) = uVar23;
            lzdec[0x11] = (this_00->super_state_base).m_cur_ofs;
            lzdec[0x12] = (this_00->super_state_base).m_cur_state;
            uVar6 = *(undefined8 *)((this_00->super_state_base).m_match_hist + 2);
            *(undefined8 *)(lzdec + 0x13) = *(undefined8 *)puVar1;
            *(undefined8 *)(lzdec + 0x15) = uVar6;
            lzdec[0xe] = local_cdc;
            *(undefined8 *)(lzdec + 0xf) = 0;
            if (pnVar24 < lzdec + 0xe) {
              pnVar24 = (node *)(lzdec + 0xe);
            }
          }
          local_cd8._0_4_ = 1;
        }
      }
      local_cdc = local_cdc + (uint)local_cd8;
      local_ccc = local_ccc + (uint)local_cd8;
      uVar14 = (ulong)(uVar19 + (uint)local_cd8);
    } while (uVar19 + (uint)local_cd8 < uVar26);
  }
  pvVar2 = &(parse_state->super_raw_parse_thread_state).m_best_decisions;
  uVar26 = (uint)pvVar2;
  cVar9 = lzham::elemental_vector::increase_capacity
                    (uVar26,SUB81(uVar14,0),1,(_func_void_void_ptr_void_ptr_uint *)0xc,true);
  if (cVar9 == '\0') {
    (parse_state->super_raw_parse_thread_state).m_failed = true;
  }
  else {
    plVar17 = pvVar2->m_p;
    uVar32 = uVar14;
    plVar22 = plVar17;
    do {
      lVar20 = (long)(int)uVar32;
      plVar22->m_dist =
           (parse_state->super_raw_parse_thread_state).m_nodes[0].m_node_states[lVar20].m_lzdec.
           m_pos;
      pnVar7 = __s->m_node_states + lVar20 + -1;
      uVar6._0_4_ = pnVar7->m_total_complexity;
      uVar6._4_2_ = pnVar7->m_parent_index;
      uVar6._6_1_ = pnVar7->m_parent_state_index;
      uVar6._7_1_ = pnVar7->field_0x37;
      plVar22->m_pos = (undefined4)uVar6;
      plVar22->m_len = (int)((ulong)uVar6 >> 0x20);
      plVar22 = plVar22 + 1;
      uVar19 = (uint)*(short *)((long)&(parse_state->super_raw_parse_thread_state).m_nodes[0].
                                       m_node_states[lVar20].m_total_cost + 4);
      uVar32 = (ulong)uVar19;
      plVar17 = plVar17 + 1;
    } while (0 < (int)uVar19);
    uVar19 = (int)((ulong)((long)plVar17 -
                          (long)(parse_state->super_raw_parse_thread_state).m_best_decisions.m_p) >>
                  2) * -0x55555555;
    if ((uVar19 <= (parse_state->super_raw_parse_thread_state).m_best_decisions.m_capacity) ||
       (cVar10 = lzham::elemental_vector::increase_capacity
                           (uVar26,SUB41(uVar19,0),
                            (uint)((parse_state->super_raw_parse_thread_state).m_best_decisions.
                                   m_size + 1 == uVar19),(_func_void_void_ptr_void_ptr_uint *)0xc,
                            true), cVar10 != '\0')) {
      (parse_state->super_raw_parse_thread_state).m_best_decisions.m_size = uVar19;
    }
    (parse_state->super_raw_parse_thread_state).m_bytes_actually_parsed = (uint)uVar14;
  }
  memset(__s,0xff,(long)pnVar24 + (0x38 - (long)__s));
  return (bool)cVar9;
}

Assistant:

bool lzcompressor::optimal_parse(parse_thread_state &parse_state)
   {
      LZHAM_ASSERT(parse_state.m_bytes_to_match <= cMaxParseGraphNodes);

      parse_state.m_failed = false;
      parse_state.m_emit_decisions_backwards = true;

      node_state *pNodes = reinterpret_cast<node_state*>(parse_state.m_nodes);
      pNodes[0].m_parent_index = -1;
      pNodes[0].m_total_cost = 0;
      pNodes[0].m_total_complexity = 0;

#ifdef LZHAM_BUILD_DEBUG
      for (uint i = 1; i < (cMaxParseGraphNodes + 1); i++)
      {
         LZHAM_ASSERT(pNodes[i].m_total_cost == cUINT64_MAX);
         LZHAM_ASSERT(pNodes[i].m_total_complexity == UINT_MAX);
         LZHAM_ASSERT(pNodes[i].m_parent_index == -1);
      }
#endif

      state &approx_state = *parse_state.m_pState;

      const uint bytes_to_parse = parse_state.m_bytes_to_match;

      const uint lookahead_start_ofs = m_accel.get_lookahead_pos() & m_accel.get_max_dict_size_mask();

      uint cur_dict_ofs = parse_state.m_start_ofs;
      uint cur_lookahead_ofs = cur_dict_ofs - lookahead_start_ofs;
      uint cur_node_index = 0;

      enum { cMaxFullMatches = cMatchAccelMaxSupportedProbes };
      uint match_lens[cMaxFullMatches];
      uint match_distances[cMaxFullMatches];

      bit_cost_t lzdec_bitcosts[cMaxMatchLen + 1];

      node_state *pMax_node_in_graph = &pNodes[0];

      while (cur_node_index < bytes_to_parse)
      {
         node_state* pCur_node = &pNodes[cur_node_index];

         if ((cur_node_index >= parse_state.m_parse_early_out_thresh) && (pCur_node == pMax_node_in_graph))
         {
            // If the best path *must* pass through this node, and we're far enough along, and we're parsing using a single thread, then exit so we can move all our state forward.
            break;
         }

         const uint max_admissable_match_len = LZHAM_MIN(static_cast<uint>(CLZBase::cMaxMatchLen), bytes_to_parse - cur_node_index);
         const uint find_dict_size = m_accel.m_cur_dict_size + cur_lookahead_ofs;

         if (cur_node_index)
         {
            LZHAM_ASSERT(pCur_node->m_parent_index >= 0);

            // Move to this node's state using the lowest cost LZ decision found.
            approx_state.restore_partial_state(pCur_node->m_saved_state);
            approx_state.partial_advance(pCur_node->m_lzdec);
         }

         const bit_cost_t cur_node_total_cost = pCur_node->m_total_cost;
         // This assert includes a fudge factor - make sure we don't overflow our scaled costs.
         LZHAM_ASSERT((cBitCostMax - cur_node_total_cost) > (cBitCostScale * 64));
         const uint cur_node_total_complexity = pCur_node->m_total_complexity;

         const uint lit_pred0 = approx_state.get_pred_char(m_accel, cur_dict_ofs, 1);
         uint is_match_model_index = LZHAM_IS_MATCH_MODEL_INDEX(approx_state.m_cur_state);

         const uint8* pLookahead = &m_accel.m_dict[cur_dict_ofs];

         // rep matches
         uint match_hist_max_len = 0;
         uint match_hist_min_match_len = 1;
         for (uint rep_match_index = 0; rep_match_index < cMatchHistSize; rep_match_index++)
         {
            uint hist_match_len = 0;

            uint dist = approx_state.m_match_hist[rep_match_index];
            if (dist <= find_dict_size)
            {
               const uint comp_pos = static_cast<uint>((m_accel.m_lookahead_pos + cur_lookahead_ofs - dist) & m_accel.m_max_dict_size_mask);
               const uint8* pComp = &m_accel.m_dict[comp_pos];

               for (hist_match_len = 0; hist_match_len < max_admissable_match_len; hist_match_len++)
                  if (pComp[hist_match_len] != pLookahead[hist_match_len])
                     break;
            }

            if (hist_match_len >= match_hist_min_match_len)
            {
               match_hist_max_len = math::maximum(match_hist_max_len, hist_match_len);

               approx_state.get_rep_match_costs(cur_dict_ofs, lzdec_bitcosts, rep_match_index, match_hist_min_match_len, hist_match_len, is_match_model_index);

               uint rep_match_total_complexity = cur_node_total_complexity + (cRep0Complexity + rep_match_index);
               for (uint l = match_hist_min_match_len; l <= hist_match_len; l++)
               {
#if LZHAM_VERIFY_MATCH_COSTS
                  {
                     lzdecision actual_dec(cur_dict_ofs, l, -((int)rep_match_index + 1));
                     bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
                     LZHAM_ASSERT(actual_cost == lzdec_bitcosts[l]);
                  }
#endif
                  node_state& dst_node = pCur_node[l];

                  bit_cost_t rep_match_total_cost = cur_node_total_cost + lzdec_bitcosts[l];

                  if ((rep_match_total_cost > dst_node.m_total_cost) || ((rep_match_total_cost == dst_node.m_total_cost) && (rep_match_total_complexity >= dst_node.m_total_complexity)))
                     continue;

                  dst_node.m_total_cost = rep_match_total_cost;
                  dst_node.m_total_complexity = rep_match_total_complexity;
                  dst_node.m_parent_index = (uint16)cur_node_index;
                  approx_state.save_partial_state(dst_node.m_saved_state);
                  dst_node.m_lzdec.init(cur_dict_ofs, l, -((int)rep_match_index + 1));
                  dst_node.m_lzdec.m_len = l;

                  pMax_node_in_graph = LZHAM_MAX(pMax_node_in_graph, &dst_node);
               }
            }

            match_hist_min_match_len = CLZBase::cMinMatchLen;
         }

         uint max_match_len = match_hist_max_len;

         if (max_match_len >= m_fast_bytes)
         {
            cur_dict_ofs += max_match_len;
            cur_lookahead_ofs += max_match_len;
            cur_node_index += max_match_len;
            continue;
         }

         // full matches
         if (max_admissable_match_len >= CLZBase::cMinMatchLen)
         {
            uint num_full_matches = 0;

            if (match_hist_max_len < 2)
            {
               // Get the nearest len2 match if we didn't find a rep len2.
               uint len2_match_dist = m_accel.get_len2_match(cur_lookahead_ofs);
               if (len2_match_dist)
               {
                  bit_cost_t cost = approx_state.get_len2_match_cost(*this, cur_dict_ofs, len2_match_dist, is_match_model_index);

#if LZHAM_VERIFY_MATCH_COSTS
                  {
                     lzdecision actual_dec(cur_dict_ofs, 2, len2_match_dist);
                     bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
                     LZHAM_ASSERT(actual_cost == cost);
                  }
#endif

                  node_state& dst_node = pCur_node[2];

                  bit_cost_t match_total_cost = cur_node_total_cost + cost;
                  uint match_total_complexity = cur_node_total_complexity + cShortMatchComplexity;

                  if ((match_total_cost < dst_node.m_total_cost) || ((match_total_cost == dst_node.m_total_cost) && (match_total_complexity < dst_node.m_total_complexity)))
                  {
                     dst_node.m_total_cost = match_total_cost;
                     dst_node.m_total_complexity = match_total_complexity;
                     dst_node.m_parent_index = (uint16)cur_node_index;
                     approx_state.save_partial_state(dst_node.m_saved_state);
                     dst_node.m_lzdec.init(cur_dict_ofs, 2, len2_match_dist);

                     pMax_node_in_graph = LZHAM_MAX(pMax_node_in_graph, &dst_node);
                  }

                  max_match_len = 2;
               }
            }

            const uint min_truncate_match_len = max_match_len;

            // Now get all full matches: the nearest matches at each match length. (Actually, we don't
            // always get the nearest match. The match finder favors those matches which have the lowest value
            // in the nibble of each match distance, all other things being equal, to help exploit how the lowest
            // nibble of match distances is separately coded.)
            const dict_match* pMatches = m_accel.find_matches(cur_lookahead_ofs);
            if (pMatches)
            {
               for ( ; ; )
               {
                  uint match_len = pMatches->get_len();
                  LZHAM_ASSERT((pMatches->get_dist() > 0) && (pMatches->get_dist() <= m_dict_size));
                  match_len = LZHAM_MIN(match_len, max_admissable_match_len);

                  if (match_len > max_match_len)
                  {
                     max_match_len = match_len;

                     match_lens[num_full_matches] = match_len;
                     match_distances[num_full_matches] = pMatches->get_dist();
                     num_full_matches++;
                  }

                  if (pMatches->is_last())
                     break;
                  pMatches++;
               }
            }

            if (num_full_matches)
            {
               uint prev_max_match_len = LZHAM_MAX(1, min_truncate_match_len);
               for (uint full_match_index = 0; full_match_index < num_full_matches; full_match_index++)
               {
                  uint start_len = prev_max_match_len + 1;
                  uint end_len = match_lens[full_match_index];
                  uint match_dist = match_distances[full_match_index];

                  LZHAM_ASSERT(start_len <= end_len);

                  approx_state.get_full_match_costs(*this, cur_dict_ofs, lzdec_bitcosts, match_dist, start_len, end_len, is_match_model_index);

                  for (uint l = start_len; l <= end_len; l++)
                  {
                     uint match_complexity = (l >= cLongMatchComplexityLenThresh) ? cLongMatchComplexity : cShortMatchComplexity;

#if LZHAM_VERIFY_MATCH_COSTS
                     {
                        lzdecision actual_dec(cur_dict_ofs, l, match_dist);
                        bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
                        LZHAM_ASSERT(actual_cost == lzdec_bitcosts[l]);
                     }
#endif
                     node_state& dst_node = pCur_node[l];

                     bit_cost_t match_total_cost = cur_node_total_cost + lzdec_bitcosts[l];
                     uint match_total_complexity = cur_node_total_complexity + match_complexity;

                     if ((match_total_cost > dst_node.m_total_cost) || ((match_total_cost == dst_node.m_total_cost) && (match_total_complexity >= dst_node.m_total_complexity)))
                        continue;

                     dst_node.m_total_cost = match_total_cost;
                     dst_node.m_total_complexity = match_total_complexity;
                     dst_node.m_parent_index = (uint16)cur_node_index;
                     approx_state.save_partial_state(dst_node.m_saved_state);
                     dst_node.m_lzdec.init(cur_dict_ofs, l, match_dist);

                     pMax_node_in_graph = LZHAM_MAX(pMax_node_in_graph, &dst_node);
                  }

                  prev_max_match_len = end_len;
               }
            }
         }

         if (max_match_len >= m_fast_bytes)
         {
            cur_dict_ofs += max_match_len;
            cur_lookahead_ofs += max_match_len;
            cur_node_index += max_match_len;
            continue;
         }

         // literal
         bit_cost_t lit_cost = approx_state.get_lit_cost(*this, m_accel, cur_dict_ofs, lit_pred0, is_match_model_index);
         bit_cost_t lit_total_cost = cur_node_total_cost + lit_cost;
         uint lit_total_complexity = cur_node_total_complexity + cLitComplexity;
#if LZHAM_VERIFY_MATCH_COSTS
         {
            lzdecision actual_dec(cur_dict_ofs, 0, 0);
            bit_cost_t actual_cost = approx_state.get_cost(*this, m_accel, actual_dec);
            LZHAM_ASSERT(actual_cost == lit_cost);
         }
#endif
         if ((lit_total_cost < pCur_node[1].m_total_cost) || ((lit_total_cost == pCur_node[1].m_total_cost) && (lit_total_complexity < pCur_node[1].m_total_complexity)))
         {
            pCur_node[1].m_total_cost = lit_total_cost;
            pCur_node[1].m_total_complexity = lit_total_complexity;
            pCur_node[1].m_parent_index = (int16)cur_node_index;
            approx_state.save_partial_state(pCur_node[1].m_saved_state);
            pCur_node[1].m_lzdec.init(cur_dict_ofs, 0, 0);

            pMax_node_in_graph = LZHAM_MAX(pMax_node_in_graph, &pCur_node[1]);
         }

         cur_dict_ofs++;
         cur_lookahead_ofs++;
         cur_node_index++;

      } // graph search

      LZHAM_ASSERT(static_cast<int>(cur_node_index) == (pMax_node_in_graph - pNodes));
      uint bytes_actually_parsed = cur_node_index;

      // Now get the optimal decisions by starting from the goal node.
      // m_best_decisions is filled backwards.
      if (!parse_state.m_best_decisions.try_reserve(bytes_actually_parsed))
      {
         parse_state.m_failed = true;

         memset(pNodes, 0xFF, (pMax_node_in_graph - pNodes + 1) * sizeof(node_state));

         LZHAM_LOG_ERROR(7037);

         return false;
      }

      int node_index = bytes_actually_parsed;
      lzdecision *pDst_dec = parse_state.m_best_decisions.get_ptr();
      do
      {
         LZHAM_ASSERT((node_index >= 0) && (node_index <= (int)cMaxParseGraphNodes));
         node_state& cur_node = pNodes[node_index];

         *pDst_dec++ = cur_node.m_lzdec;

         node_index = cur_node.m_parent_index;

      } while (node_index > 0);

      parse_state.m_best_decisions.try_resize_no_construct(static_cast<uint>(pDst_dec - parse_state.m_best_decisions.get_ptr()));

      parse_state.m_bytes_actually_parsed = bytes_actually_parsed;

      memset(pNodes, 0xFF, (pMax_node_in_graph - pNodes + 1) * sizeof(node_state));

      return true;
   }